

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O3

bool __thiscall CExtPubKey::Derive(CExtPubKey *this,CExtPubKey *out,uint _nChild)

{
  bool bVar1;
  long in_FS_OFFSET;
  CKeyID id;
  CKeyID local_44;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nDepth == 0xff) {
    bVar1 = false;
  }
  else {
    out->nDepth = this->nDepth + '\x01';
    CPubKey::GetID(&local_44,&this->pubkey);
    *(undefined4 *)out->vchFingerprint =
         local_44.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_;
    out->nChild = _nChild;
    bVar1 = CPubKey::Derive(&this->pubkey,&out->pubkey,&out->chaincode,_nChild,&this->chaincode);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CExtPubKey::Derive(CExtPubKey &out, unsigned int _nChild) const {
    if (nDepth == std::numeric_limits<unsigned char>::max()) return false;
    out.nDepth = nDepth + 1;
    CKeyID id = pubkey.GetID();
    memcpy(out.vchFingerprint, &id, 4);
    out.nChild = _nChild;
    return pubkey.Derive(out.pubkey, out.chaincode, _nChild, chaincode);
}